

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

KOption getoption(Header *h,char **fmt,size_t *size)

{
  char cVar1;
  char *pcVar2;
  uint uVar3;
  size_t sVar4;
  KOption KVar5;
  
  pcVar2 = *fmt;
  *fmt = pcVar2 + 1;
  cVar1 = *pcVar2;
  *size = 0;
  switch(cVar1) {
  case 'b':
    *size = 1;
    goto LAB_00118486;
  case 'c':
    sVar4 = getnum(fmt,0xffffffffffffffff);
    *size = sVar4;
    KVar5 = Kchar;
    if (sVar4 == 0xffffffffffffffff) {
      luaL_error(h->L,"missing size for format option \'c\'");
    }
    break;
  case 'd':
    *size = 8;
    KVar5 = Kdouble;
    break;
  case 'e':
  case 'g':
  case 'k':
  case 'm':
  case 'o':
  case 'p':
  case 'q':
  case 'r':
  case 't':
  case 'u':
  case 'v':
  case 'w':
  case 'y':
switchD_001183db_caseD_65:
    luaL_error(h->L,"invalid format option \'%c\'",(ulong)(uint)(int)cVar1);
    return Knop;
  case 'f':
    *size = 4;
    KVar5 = Kfloat;
    break;
  case 'h':
    *size = 2;
    goto LAB_00118486;
  case 'i':
    uVar3 = getnumlimit(h,fmt,4);
    *size = (ulong)uVar3;
    goto LAB_00118486;
  case 'j':
  case 'l':
    *size = 8;
LAB_00118486:
    KVar5 = Kint;
    break;
  case 'n':
    *size = 8;
    KVar5 = Knumber;
    break;
  case 's':
    uVar3 = getnumlimit(h,fmt,8);
    *size = (ulong)uVar3;
    KVar5 = Kstring;
    break;
  case 'x':
    *size = 1;
    KVar5 = Kpadding;
    break;
  case 'z':
    KVar5 = Kzstr;
    break;
  default:
    switch(cVar1) {
    case '<':
    case '=':
      h->islittle = 1;
      return Knop;
    case '>':
      h->islittle = 0;
      return Knop;
    case '?':
    case '@':
    case 'A':
    case 'C':
    case 'D':
    case 'E':
    case 'F':
    case 'G':
    case 'K':
      goto switchD_001183db_caseD_65;
    case 'B':
      *size = 1;
      break;
    case 'H':
      *size = 2;
      break;
    case 'I':
      uVar3 = getnumlimit(h,fmt,4);
      *size = (ulong)uVar3;
      break;
    default:
      if (cVar1 == ' ') {
        return Knop;
      }
      if (cVar1 == '!') {
        uVar3 = getnumlimit(h,fmt,8);
        h->maxalign = uVar3;
        return Knop;
      }
      if (cVar1 != 'T') {
        if (cVar1 == 'X') {
          return Kpaddalign;
        }
        goto switchD_001183db_caseD_65;
      }
    case 'J':
    case 'L':
      *size = 8;
    }
    KVar5 = Kuint;
  }
  return KVar5;
}

Assistant:

static KOption getoption (Header *h, const char **fmt, size_t *size) {
  /* dummy structure to get native alignment requirements */
  struct cD { char c; union { LUAI_MAXALIGN; } u; };
  int opt = *((*fmt)++);
  *size = 0;  /* default */
  switch (opt) {
    case 'b': *size = sizeof(char); return Kint;
    case 'B': *size = sizeof(char); return Kuint;
    case 'h': *size = sizeof(short); return Kint;
    case 'H': *size = sizeof(short); return Kuint;
    case 'l': *size = sizeof(long); return Kint;
    case 'L': *size = sizeof(long); return Kuint;
    case 'j': *size = sizeof(lua_Integer); return Kint;
    case 'J': *size = sizeof(lua_Integer); return Kuint;
    case 'T': *size = sizeof(size_t); return Kuint;
    case 'f': *size = sizeof(float); return Kfloat;
    case 'n': *size = sizeof(lua_Number); return Knumber;
    case 'd': *size = sizeof(double); return Kdouble;
    case 'i': *size = getnumlimit(h, fmt, sizeof(int)); return Kint;
    case 'I': *size = getnumlimit(h, fmt, sizeof(int)); return Kuint;
    case 's': *size = getnumlimit(h, fmt, sizeof(size_t)); return Kstring;
    case 'c':
      *size = getnum(fmt, cast_sizet(-1));
      if (l_unlikely(*size == cast_sizet(-1)))
        luaL_error(h->L, "missing size for format option 'c'");
      return Kchar;
    case 'z': return Kzstr;
    case 'x': *size = 1; return Kpadding;
    case 'X': return Kpaddalign;
    case ' ': break;
    case '<': h->islittle = 1; break;
    case '>': h->islittle = 0; break;
    case '=': h->islittle = nativeendian.little; break;
    case '!': {
      const size_t maxalign = offsetof(struct cD, u);
      h->maxalign = getnumlimit(h, fmt, maxalign);
      break;
    }
    default: luaL_error(h->L, "invalid format option '%c'", opt);
  }
  return Knop;
}